

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O2

void __thiscall
nrg::SyncExecutor::operator()
          (SyncExecutor *this,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *fn,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_3)

{
  Function f;
  _Any_data local_78;
  long local_68;
  undefined8 local_60;
  _Any_data local_50;
  long local_40;
  undefined8 uStack_38;
  _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_30;
  undefined1 local_28 [24];
  
  local_28._0_8_ = &local_30;
  local_30 = fn;
  local_28._8_8_ = param;
  local_28._16_8_ = param_3;
  std::function<void()>::operator()
            ((function<void()> *)local_50._M_pod_data,(anon_class_24_3_7e084ec6 *)local_28);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = 0;
  local_60 = uStack_38;
  if (local_40 != 0) {
    local_78._M_unused._M_object = local_50._M_unused._M_object;
    local_78._8_8_ = local_50._8_8_;
    local_68 = local_40;
    local_40 = 0;
    uStack_38 = 0;
  }
  operator()(this,(Function *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return;
}

Assistant:

void operator()(FN fn, Param&&... param)
    {
        Function f([&]() { fn(std::forward<Param>(param)...); });
        (*this)(std::move(f));
    }